

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void __thiscall
kj::Vector<capnp::compiler::NodeTranslator::UnfinishedValue>::setCapacity
          (Vector<capnp::compiler::NodeTranslator::UnfinishedValue> *this,size_t newSize)

{
  UnfinishedValue *pUVar1;
  UnfinishedValue *__dest;
  size_t __n;
  ArrayBuilder<capnp::compiler::NodeTranslator::UnfinishedValue> local_38;
  
  pUVar1 = (this->builder).ptr;
  if (newSize < (ulong)(((long)(this->builder).pos - (long)pUVar1) / 0x90)) {
    (this->builder).pos = pUVar1 + newSize;
  }
  __dest = kj::_::HeapArrayDisposer::
           allocateUninitialized<capnp::compiler::NodeTranslator::UnfinishedValue>(newSize);
  local_38.endPtr = __dest + newSize;
  local_38.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  pUVar1 = (this->builder).ptr;
  __n = (long)(this->builder).pos - (long)pUVar1;
  local_38.ptr = __dest;
  if (__n != 0) {
    memcpy(__dest,pUVar1,__n);
  }
  local_38.pos = (RemoveConst<capnp::compiler::NodeTranslator::UnfinishedValue> *)
                 ((long)__dest + __n);
  ArrayBuilder<capnp::compiler::NodeTranslator::UnfinishedValue>::operator=
            (&this->builder,&local_38);
  ArrayBuilder<capnp::compiler::NodeTranslator::UnfinishedValue>::dispose(&local_38);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }